

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

__m256i * highbd_get_recon_16x8_avx2(__m256i pred,__m256i res0,__m256i res1,int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i u;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m256i *palVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i x1;
  __m256i x0;
  undefined8 local_200;
  undefined8 uStackY_1f8;
  undefined8 uStackY_1f0;
  
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar1 = vpmovsxwd_avx2(auVar6);
  auVar5._8_8_ = in_register_00001218;
  auVar5._0_8_ = in_YMM0_H;
  auVar2 = vpmovsxwd_avx2(auVar5);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar4._16_8_ = in_YMM1_H;
  auVar4._24_8_ = in_register_00001258;
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  local_200 = auVar2._0_8_;
  uStackY_1f8 = auVar2._8_8_;
  uStackY_1f0 = auVar2._16_8_;
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  auVar3._16_8_ = in_YMM2_H;
  auVar3._24_8_ = in_register_00001298;
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar1 = vpackusdw_avx2(auVar1,auVar2);
  vpermq_avx2(auVar1,0xd8);
  u[1] = local_200;
  u[0] = in_register_00001218;
  u[2] = uStackY_1f8;
  u[3] = uStackY_1f0;
  palVar7 = highbd_clamp_epi16_avx2(u,(int)((ulong)in_YMM0_H >> 0x20));
  return palVar7;
}

Assistant:

static inline __m256i highbd_get_recon_16x8_avx2(const __m256i pred,
                                                 __m256i res0, __m256i res1,
                                                 const int bd) {
  __m256i x0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(pred));
  __m256i x1 = _mm256_cvtepi16_epi32(_mm256_extractf128_si256(pred, 1));

  x0 = _mm256_add_epi32(res0, x0);
  x1 = _mm256_add_epi32(res1, x1);
  x0 = _mm256_packus_epi32(x0, x1);
  x0 = _mm256_permute4x64_epi64(x0, 0xd8);
  x0 = highbd_clamp_epi16_avx2(x0, bd);
  return x0;
}